

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_ceil>(Mat *a,Option *opt)

{
  long *in_RDI;
  float fVar1;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_ceil op;
  Mat *m;
  __m128 fixed_result;
  __m128 positive_fix;
  __m128 truncated_with_sign;
  __m128 truncated;
  __m128 no_fraction;
  __m128 negative_mask;
  __m128 absolute;
  __m128 magic_smallest_no_fraction;
  __m128 magic_negative_zero;
  ulong local_438;
  ulong uStack_430;
  int local_424;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined4 local_408;
  long local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined8 local_3e0;
  float *local_3d8;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  undefined1 local_3b1 [9];
  long *local_3a8;
  undefined1 local_39d;
  int local_39c;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_378;
  float *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float *local_358;
  long local_350;
  undefined4 local_344;
  long local_340;
  float *local_338;
  undefined4 local_32c;
  int local_328;
  int local_324;
  undefined8 *local_320;
  undefined4 local_314;
  long local_310;
  undefined8 *local_300;
  ulong *local_2d8;
  undefined1 *local_2d0;
  float *local_2c8;
  undefined1 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  uint local_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  ulong local_228;
  ulong uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong uStack_180;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  ulong local_f8;
  ulong uStack_f0;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  ulong uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_3b8 = *(int *)((long)in_RDI + 0x2c);
  local_3bc = (int)in_RDI[6];
  local_3c0 = *(int *)((long)in_RDI + 0x34);
  local_3c4 = (int)in_RDI[7];
  local_3c8 = (int)in_RDI[3];
  local_3cc = local_3b8 * local_3bc * local_3c0 * local_3c8;
  local_3a8 = in_RDI;
  for (local_3d0 = 0; local_3d0 < local_3c4; local_3d0 = local_3d0 + 1) {
    local_390 = &local_420;
    local_324 = *(int *)((long)local_3a8 + 0x2c);
    local_328 = (int)local_3a8[6];
    local_32c = *(undefined4 *)((long)local_3a8 + 0x34);
    local_338 = (float *)(*local_3a8 + local_3a8[8] * (long)local_3d0 * local_3a8[2]);
    local_340 = local_3a8[2];
    local_344 = (undefined4)local_3a8[3];
    local_350 = local_3a8[4];
    local_320 = &local_420;
    local_310 = (long)local_324 * (long)local_328 * local_340;
    local_388 = &local_420;
    local_378 = &local_420;
    local_314 = 0x10;
    local_39c = local_3d0;
    local_39d = 1;
    local_420 = 0;
    local_410 = 0;
    local_408 = 0;
    local_3f8 = 0;
    local_3f4 = 0;
    local_3f0 = 0;
    local_3ec = 0;
    local_3e8 = 0;
    local_3e0 = 0;
    local_418 = 0;
    local_3d8 = local_338;
    for (local_424 = 0; local_300 = local_378, local_400 = local_350, local_424 + 3 < local_3cc;
        local_424 = local_424 + 4) {
      local_370 = local_3d8;
      local_228 = *(ulong *)local_3d8;
      uStack_220 = *(ulong *)(local_3d8 + 2);
      local_2d0 = local_3b1;
      local_2d8 = &local_438;
      local_16c = 0x80000000;
      local_8c = 0x80000000;
      local_a8 = 0x80000000;
      local_238 = 0x8000000080000000;
      uStack_230 = 0x8000000080000000;
      local_170 = 0x4b000000;
      local_6c = 0x4b000000;
      local_88 = 0x4b000000;
      local_248 = 0x4b0000004b000000;
      uStack_240 = 0x4b0000004b000000;
      local_258 = local_228 & 0x7fffffff7fffffff;
      uStack_250 = uStack_220 & 0x7fffffff7fffffff;
      local_268 = local_228 & 0x8000000080000000;
      uStack_260 = uStack_220 & 0x8000000080000000;
      local_128._0_4_ = (float)local_258;
      local_128._4_4_ = (float)(local_258 >> 0x20);
      uStack_120._0_4_ = (float)uStack_250;
      uStack_120._4_4_ = (float)(uStack_250 >> 0x20);
      local_278 = -(uint)(8388608.0 < (float)local_128);
      uStack_274 = -(uint)(8388608.0 < local_128._4_4_);
      uStack_270 = -(uint)(8388608.0 < (float)uStack_120);
      uStack_26c = -(uint)(8388608.0 < uStack_120._4_4_);
      local_108 = (int)(float)local_128;
      iStack_104 = (int)local_128._4_4_;
      iStack_100 = (int)(float)uStack_120;
      iStack_fc = (int)uStack_120._4_4_;
      local_288 = (float)local_108;
      fStack_284 = (float)iStack_104;
      fStack_280 = (float)iStack_100;
      fStack_27c = (float)iStack_fc;
      local_b8 = CONCAT44(fStack_284,local_288);
      uStack_b0 = CONCAT44(fStack_27c,fStack_280);
      local_298 = local_b8 | local_268;
      uStack_290 = uStack_b0 | uStack_260;
      local_18._0_4_ = (float)local_228;
      local_18._4_4_ = (float)(local_228 >> 0x20);
      uStack_10._0_4_ = (float)uStack_220;
      uStack_10._4_4_ = (float)(uStack_220 >> 0x20);
      local_1c8 = -(uint)(-0.0 < (float)local_18);
      iStack_1c4 = -(uint)(-0.0 < local_18._4_4_);
      iStack_1c0 = -(uint)(-0.0 < (float)uStack_10);
      iStack_1bc = -(uint)(-0.0 < uStack_10._4_4_);
      local_48._0_4_ = (float)local_298;
      local_48._4_4_ = (float)(local_298 >> 0x20);
      uStack_40._0_4_ = (float)uStack_290;
      uStack_40._4_4_ = (float)(uStack_290 >> 0x20);
      local_1d8 = -(uint)((float)local_48 < (float)local_18);
      iStack_1d4 = -(uint)(local_48._4_4_ < local_18._4_4_);
      iStack_1d0 = -(uint)((float)uStack_40 < (float)uStack_10);
      iStack_1cc = -(uint)(uStack_40._4_4_ < uStack_10._4_4_);
      local_1e8 = CONCAT44(iStack_1c4,local_1c8) & CONCAT44(iStack_1d4,local_1d8);
      uStack_1e0 = CONCAT44(iStack_1bc,iStack_1c0) & CONCAT44(iStack_1cc,iStack_1d0);
      local_174 = 0xbf800000;
      local_4c = 0xbf800000;
      local_68 = 0xbf800000;
      local_1f8 = 0xbf800000bf800000;
      uStack_1f0 = 0xbf800000bf800000;
      local_2a8 = local_1e8 & 0xbf800000bf800000;
      uStack_2a0 = uStack_1e0 & 0xbf800000bf800000;
      local_198._0_4_ = (float)local_2a8;
      local_198._4_4_ = (float)(local_2a8 >> 0x20);
      uStack_190._0_4_ = (float)uStack_2a0;
      uStack_190._4_4_ = (float)(uStack_2a0 >> 0x20);
      local_2b8 = (float)local_48 - (float)local_198;
      fStack_2b4 = local_48._4_4_ - local_198._4_4_;
      fStack_2b0 = (float)uStack_40 - (float)uStack_190;
      fStack_2ac = uStack_40._4_4_ - uStack_190._4_4_;
      local_218 = CONCAT44(uStack_274,local_278);
      uStack_210 = CONCAT44(uStack_26c,uStack_270);
      local_d8 = local_228 & local_218;
      uStack_d0 = uStack_220 & uStack_210;
      local_158 = CONCAT44(uStack_274,local_278);
      uStack_150 = CONCAT44(uStack_26c,uStack_270);
      local_168 = CONCAT44(fStack_2b4,local_2b8);
      uStack_160 = CONCAT44(fStack_2ac,fStack_2b0);
      local_e8 = (local_278 ^ 0xffffffff) & (uint)local_2b8;
      uStack_e4 = (uStack_274 ^ 0xffffffff) & (uint)fStack_2b4;
      uStack_e0 = (uStack_270 ^ 0xffffffff) & (uint)fStack_2b0;
      uStack_dc = (uStack_26c ^ 0xffffffff) & (uint)fStack_2ac;
      local_438 = local_d8 | CONCAT44(uStack_e4,local_e8);
      uStack_430 = uStack_d0 | CONCAT44(uStack_dc,uStack_e0);
      local_358 = local_3d8;
      local_368._0_4_ = (float)local_438;
      local_368._4_4_ = (float)(local_438 >> 0x20);
      uStack_360._0_4_ = (float)uStack_430;
      uStack_360._4_4_ = (float)(uStack_430 >> 0x20);
      *local_3d8 = (float)local_368;
      local_3d8[1] = local_368._4_4_;
      local_3d8[2] = (float)uStack_360;
      local_3d8[3] = uStack_360._4_4_;
      local_3d8 = local_3d8 + 4;
      local_368 = local_438;
      uStack_360 = uStack_430;
      local_208 = local_228;
      uStack_200 = uStack_220;
      local_1b8 = local_228;
      uStack_1b0 = uStack_220;
      local_1a8 = local_238;
      uStack_1a0 = uStack_230;
      local_198 = local_2a8;
      uStack_190 = uStack_2a0;
      local_188 = local_298;
      uStack_180 = uStack_290;
      local_148 = local_228;
      uStack_140 = uStack_220;
      local_138 = local_238;
      uStack_130 = uStack_230;
      local_128 = local_258;
      uStack_120 = uStack_250;
      local_118 = local_248;
      uStack_110 = uStack_240;
      local_f8 = local_258;
      uStack_f0 = uStack_250;
      local_c8 = local_268;
      uStack_c0 = uStack_260;
      uStack_a4 = local_a8;
      uStack_a0 = local_a8;
      uStack_9c = local_a8;
      uStack_84 = local_88;
      uStack_80 = local_88;
      uStack_7c = local_88;
      uStack_64 = local_68;
      uStack_60 = local_68;
      uStack_5c = local_68;
      local_48 = local_298;
      uStack_40 = uStack_290;
      local_38 = local_228;
      uStack_30 = uStack_220;
      local_28 = local_238;
      uStack_20 = uStack_230;
      local_18 = local_228;
      uStack_10 = uStack_220;
    }
    for (; local_424 < local_3cc; local_424 = local_424 + 1) {
      local_2c0 = local_3b1;
      local_2c8 = local_3d8;
      fVar1 = ceilf(*local_3d8);
      *local_3d8 = fVar1;
      local_3d8 = local_3d8 + 1;
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}